

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

DdNode * cuddHashTableLookup(DdHashTable *hash,DdNodePtr *key)

{
  long lVar1;
  ptrint *ppVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  DdNode *pDVar7;
  DdHashItem *pDVar8;
  DdHashItem *pDVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  DdHashItem *pDVar13;
  DdHashItem **ppDVar14;
  bool bVar15;
  
  uVar4 = hash->keysize;
  uVar10 = (ulong)uVar4;
  uVar12 = *(int *)key * 0x40f1f9;
  if (1 < uVar10) {
    uVar6 = 1;
    do {
      uVar12 = uVar12 * 0xc00005 + *(int *)(key + uVar6);
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  uVar6 = (ulong)(uVar12 >> ((byte)hash->shift & 0x1f));
  pDVar7 = (DdNode *)hash->bucket;
  pDVar13 = (DdHashItem *)0x0;
  pDVar8 = *(DdHashItem **)(&pDVar7->index + uVar6 * 2);
  do {
    if (pDVar8 == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    bVar15 = uVar10 != 0;
    if (uVar10 == 0) {
LAB_007eedc5:
      pDVar7 = pDVar8->value;
      ppVar2 = &pDVar8->count;
      *ppVar2 = *ppVar2 + -1;
      pDVar9 = pDVar8;
      if (*ppVar2 == 0) {
        piVar3 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar3 = *piVar3 + -1;
        ppDVar14 = &pDVar13->next;
        if (pDVar13 == (DdHashItem *)0x0) {
          ppDVar14 = hash->bucket + uVar6;
        }
        *ppDVar14 = pDVar8->next;
        pDVar8->next = hash->nextFree;
        hash->nextFree = pDVar8;
        hash->size = hash->size - 1;
      }
    }
    else {
      if (*key == pDVar8->key[0]) {
        lVar11 = 0;
        do {
          if (uVar4 - 1 == (int)lVar11) {
            bVar15 = false;
            goto LAB_007eedc5;
          }
          lVar5 = lVar11 + 1;
          lVar1 = lVar11 + 1;
          ppDVar14 = (DdHashItem **)((long)(pDVar8 + 1) + lVar11 * 8);
          lVar11 = lVar1;
        } while (key[lVar5] == (DdNodePtr)*ppDVar14);
        bVar15 = (uint)lVar1 < uVar4;
      }
      pDVar9 = pDVar8->next;
      pDVar13 = pDVar8;
    }
    pDVar8 = pDVar9;
    if (!bVar15) {
      return pDVar7;
    }
  } while( true );
}

Assistant:

DdNode *
cuddHashTableLookup(
  DdHashTable * hash,
  DdNodePtr * key)
{
    unsigned int posn;
    DdHashItem *item, *prev;
    unsigned int i, keysize;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    posn = ddLCHash(key,hash->keysize,hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    keysize = hash->keysize;
    while (item != NULL) {
        DdNodePtr *key2 = item->key;
        int equal = 1;
        for (i = 0; i < keysize; i++) {
            if (key[i] != key2[i]) {
                equal = 0;
                break;
            }
        }
        if (equal) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}